

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

void __thiscall libtorrent::session::~session(session *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  if ((this->m_impl).super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    aux::dump_call_profile();
    aux::session_impl::call_abort
              ((this->m_impl).
               super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    if ((((this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) &&
        (p_Var2 = (this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi, p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
       && (p_Var2->_M_use_count == 1)) {
      ::std::thread::join();
    }
  }
  p_Var2 = (this->m_impl).
           super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->m_io_service).
           super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->super_session_handle).m_impl.
           super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

session::~session()
	{
		if (!m_impl) return;

		aux::dump_call_profile();

		// capture the shared_ptr in the dispatched function
		// to keep the session_impl alive
		m_impl->call_abort();

		if (m_thread && m_thread.use_count() == 1)
		{
#if defined TORRENT_ASIO_DEBUGGING
			wait_for_asio_handlers();
#endif
			m_thread->join();
		}
	}